

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

BatchResult * __thiscall CompiledProjectOperator::next(CompiledProjectOperator *this)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  pointer input;
  BatchResult *rs;
  DbVector *local_30;
  DbVector *vec;
  unique_ptr<BatchResult,_std::default_delete<BatchResult>_> local_20;
  unique_ptr<BatchResult,_std::default_delete<BatchResult>_> br;
  CompiledProjectOperator *this_local;
  
  br._M_t.super___uniq_ptr_impl<BatchResult,_std::default_delete<BatchResult>_>._M_t.
  super__Tuple_impl<0UL,_BatchResult_*,_std::default_delete<BatchResult>_>.
  super__Head_base<0UL,_BatchResult_*,_false>._M_head_impl =
       (__uniq_ptr_data<BatchResult,_std::default_delete<BatchResult>,_true,_true>)
       (__uniq_ptr_data<BatchResult,_std::default_delete<BatchResult>,_true,_true>)this;
  iVar2 = (*this->next_->_vptr_BaseOperator[4])();
  std::unique_ptr<BatchResult,std::default_delete<BatchResult>>::
  unique_ptr<std::default_delete<BatchResult>,void>
            ((unique_ptr<BatchResult,std::default_delete<BatchResult>> *)&local_20,
             (pointer)CONCAT44(extraout_var,iVar2));
  bVar1 = std::operator==(&local_20,(nullptr_t)0x0);
  if (bVar1) {
    this_local = (CompiledProjectOperator *)0x0;
  }
  else {
    local_30 = (DbVector *)0x0;
    input = std::unique_ptr<BatchResult,_std::default_delete<BatchResult>_>::get(&local_20);
    evaluateExpr_(this,&local_30,input);
    this_local = (CompiledProjectOperator *)operator_new(0x30);
    BatchResult::BatchResult((BatchResult *)this_local);
    BatchResult::add((BatchResult *)this_local,&this->col_name_,local_30);
  }
  vec._4_4_ = 1;
  std::unique_ptr<BatchResult,_std::default_delete<BatchResult>_>::~unique_ptr(&local_20);
  return (BatchResult *)this_local;
}

Assistant:

BatchResult* next() {
        std::unique_ptr<BatchResult> br(next_->next());
        if (br == nullptr)
            return nullptr;

        DbVector* vec = nullptr;
        evaluateExpr_(&vec, br.get());

        BatchResult* rs = new BatchResult();
        rs->add(col_name_, vec);
        return rs;
    }